

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

int archive_write_mtree_header(archive_write *a,archive_entry *entry)

{
  undefined8 *puVar1;
  size_t sVar2;
  unsigned_long uVar3;
  time_t tVar4;
  dev_t dVar5;
  bool bVar6;
  archive_string *dest;
  mode_t mVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int64_t iVar11;
  mtree_entry_conflict *pmVar12;
  archive_entry *entry_00;
  time_t t;
  char *pcVar13;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  char *n;
  mtree_entry_conflict *pmVar17;
  mtree_entry_conflict *me;
  mtree_entry_conflict *local_170;
  archive_string local_168;
  char *local_150;
  archive_string *local_148;
  mtree_entry_conflict *local_140;
  char name [256];
  
  puVar1 = (undefined8 *)a->format_data;
  if (*(int *)(puVar1 + 0xe) != 0) {
    *(undefined4 *)(puVar1 + 0xe) = 0;
    archive_strcat((archive_string *)(puVar1 + 0xb),"#mtree\n");
    if ((*(uint *)(puVar1 + 0x1e) & 0x380238) == 0) {
      *(undefined4 *)((long)puVar1 + 0xfc) = 0;
    }
  }
  iVar11 = archive_entry_size(entry);
  puVar1[0xf] = iVar11;
  if ((*(int *)((long)puVar1 + 0xf4) != 0) &&
     (mVar7 = archive_entry_filetype(entry), mVar7 != 0x4000)) {
    return 0;
  }
  iVar8 = mtree_entry_new(a,entry,&local_170);
  me = local_170;
  if (iVar8 < -0x14) {
    return iVar8;
  }
  pcVar13 = (char *)a->format_data;
  sVar2 = (local_170->parentdir).length;
  if (sVar2 == 0) {
    if (((local_170->basename).length != 1) || (*(local_170->basename).s != '.')) {
      pcVar13 = (local_170->pathname).s;
      pcVar15 = "Internal programing error in generating canonical name for %s";
      goto LAB_00153baa;
    }
    local_170->parent = local_170;
    pmVar12 = *(mtree_entry_conflict **)(pcVar13 + 8);
    if (pmVar12 == (mtree_entry_conflict *)0x0) {
      *(mtree_entry_conflict **)(pcVar13 + 8) = local_170;
      local_170->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(pcVar13 + 0x38) = local_170;
      *(mtree_entry_conflict ***)(pcVar13 + 0x38) = &local_170->next;
      goto LAB_00153cd8;
    }
  }
  else {
    pcVar15 = (local_170->parentdir).s;
    pcVar14 = extraout_RDX;
    if ((*(size_t *)(pcVar13 + 0x20) != sVar2) ||
       (iVar9 = strcmp(((archive_string *)(pcVar13 + 0x18))->s,pcVar15), pcVar14 = extraout_RDX_00,
       iVar9 != 0)) {
      n = pcVar15;
      pmVar17 = *(mtree_entry_conflict **)(pcVar13 + 8);
      local_148 = (archive_string *)(pcVar13 + 0x18);
LAB_001537a4:
      uVar10 = get_path_component(name,(size_t)n,pcVar14);
      pcVar14 = pcVar15;
      if (uVar10 != 0) {
        if ((int)uVar10 < 0) {
          iVar9 = -0x1e;
          archive_set_error(&a->archive,-1,"A name buffer is too small");
          goto LAB_00153bba;
        }
        uVar16 = (ulong)uVar10;
        if (((uVar10 == 1) && (name[0] == '.')) && (pmVar17 != (mtree_entry_conflict *)0x0)) {
          if (pmVar17 == *(mtree_entry_conflict **)(pcVar13 + 8)) {
            pcVar14 = extraout_RDX_01;
            if (n[1] == '/') {
              n = n + 2;
            }
            else {
              n = n + 1;
            }
            goto LAB_001537a4;
          }
        }
        else if (pmVar17 == (mtree_entry_conflict *)0x0) {
          pmVar17 = (mtree_entry_conflict *)0x0;
          goto LAB_0015389c;
        }
        pmVar12 = (mtree_entry_conflict *)
                  __archive_rb_tree_find_node(&pmVar17->dir_info->rbtree,name);
        if (pmVar12 == (mtree_entry_conflict *)0x0) goto LAB_0015389c;
        if (*n == '\0') goto LAB_00153b8b;
        if (pmVar12->dir_info == (dir_info *)0x0) {
          archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                            (pmVar12->pathname).s,(me->pathname).s);
          goto LAB_00153bb7;
        }
        pcVar14 = n + (n[uVar16] == '/') + uVar16;
        n = pcVar14;
        pmVar17 = pmVar12;
        goto LAB_001537a4;
      }
      uVar16 = 0;
LAB_0015389c:
      do {
        local_150 = pcVar14;
        dest = local_148;
        if (*n == '\0') goto LAB_00153a77;
        local_168.s = (char *)0x0;
        local_168.length = 0;
        local_168.buffer_length = 0;
        archive_strncat(&local_168,pcVar15,(size_t)(n + (uVar16 - (long)pcVar15)));
        pcVar15 = local_168.s;
        if (local_168.s[local_168.length - 1] == '/') {
          local_168.s[local_168.length - 1] = '\0';
          local_168.length = local_168.length - 1;
        }
        entry_00 = archive_entry_new();
        if (entry_00 == (archive_entry *)0x0) {
LAB_00153956:
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
          bVar6 = true;
          iVar9 = -0x1e;
          pmVar12 = (mtree_entry_conflict *)0x0;
        }
        else {
          archive_entry_copy_pathname(entry_00,pcVar15);
          archive_entry_set_mode(entry_00,0x41ed);
          t = time((time_t *)0x0);
          archive_entry_set_mtime(entry_00,t,0);
          iVar9 = mtree_entry_new(a,entry_00,&local_140);
          archive_entry_free(entry_00);
          if (iVar9 < -0x14) goto LAB_00153956;
          local_140->dir_info->virtual = 1;
          bVar6 = false;
          iVar9 = 0;
          pmVar12 = local_140;
        }
        archive_string_free(&local_168);
        if (bVar6) goto LAB_00153bba;
        pcVar15 = (pmVar12->pathname).s;
        if ((*pcVar15 == '.') && (pcVar15[1] == '\0')) {
          *(mtree_entry_conflict **)(pcVar13 + 8) = pmVar12;
          pmVar17 = pmVar12;
        }
        else {
          __archive_rb_tree_insert_node(&pmVar17->dir_info->rbtree,&pmVar12->rbnode);
        }
        pcVar15 = local_150;
        pmVar12->parent = pmVar17;
        pmVar12->next = (mtree_entry_conflict *)0x0;
        **(undefined8 **)(pcVar13 + 0x38) = pmVar12;
        *(mtree_entry_conflict ***)(pcVar13 + 0x38) = &pmVar12->next;
        n = n + (n[uVar16] == '/') + uVar16;
        uVar10 = get_path_component(name,(size_t)n,pcVar13);
        if ((int)uVar10 < 0) {
          archive_string_free(&local_168);
          archive_set_error(&a->archive,-1,"A name buffer is too small");
          iVar9 = -0x1e;
          goto LAB_00153bba;
        }
        uVar16 = (ulong)uVar10;
        pmVar17 = pmVar12;
        pcVar14 = local_150;
      } while( true );
    }
    iVar9 = __archive_rb_tree_insert_node
                      (*(archive_rb_tree **)(*(long *)(pcVar13 + 0x10) + 0x28),&me->rbnode);
    if (iVar9 != 0) {
      me->parent = *(mtree_entry_conflict **)(pcVar13 + 0x10);
      me->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(pcVar13 + 0x38) = me;
      *(mtree_entry_conflict ***)(pcVar13 + 0x38) = &me->next;
      goto LAB_00153cd8;
    }
    pmVar12 = (mtree_entry_conflict *)
              __archive_rb_tree_find_node
                        (&(*(mtree_entry_conflict **)(pcVar13 + 0x10))->dir_info->rbtree,
                         (me->basename).s);
  }
LAB_00153b8b:
  if (((me->mode ^ pmVar12->mode) & 0xf000) != 0) {
    pcVar13 = (pmVar12->pathname).s;
    pcVar15 = "Found duplicate entries `%s\' and its file type is different";
LAB_00153baa:
    archive_set_error(&a->archive,-1,pcVar15,pcVar13);
LAB_00153bb7:
    iVar9 = -0x19;
LAB_00153bba:
    mtree_entry_free(local_170);
    return iVar9;
  }
  (pmVar12->symlink).length = 0;
  archive_string_concat(&pmVar12->symlink,&me->symlink);
  (pmVar12->uname).length = 0;
  archive_string_concat(&pmVar12->uname,&me->uname);
  (pmVar12->gname).length = 0;
  archive_string_concat(&pmVar12->gname,&me->gname);
  (pmVar12->fflags_text).length = 0;
  archive_string_concat(&pmVar12->fflags_text,&me->fflags_text);
  mVar7 = me->filetype;
  pmVar12->nlink = me->nlink;
  pmVar12->filetype = mVar7;
  pmVar12->mode = me->mode;
  iVar11 = me->uid;
  pmVar12->size = me->size;
  pmVar12->uid = iVar11;
  uVar3 = me->fflags_clear;
  pmVar12->fflags_set = me->fflags_set;
  pmVar12->fflags_clear = uVar3;
  tVar4 = me->mtime;
  pmVar12->gid = me->gid;
  pmVar12->mtime = tVar4;
  pmVar12->mtime_nsec = me->mtime_nsec;
  dVar5 = me->rdevminor;
  pmVar12->rdevmajor = me->rdevmajor;
  pmVar12->rdevminor = dVar5;
  dVar5 = me->devminor;
  pmVar12->devmajor = me->devmajor;
  pmVar12->devminor = dVar5;
  pmVar12->ino = me->ino;
  if (pmVar12->dir_info != (dir_info *)0x0) {
    pmVar12->dir_info->virtual = 0;
  }
  mtree_entry_free(me);
  me = pmVar12;
LAB_00153cd8:
  *puVar1 = me;
  if ((me->reg_info != (reg_info *)0x0) &&
     (*(undefined4 *)(puVar1 + 0x1c) = 0, (*(byte *)(puVar1 + 0x1e) & 1) != 0)) {
    puVar1[0x1c] = 1;
    puVar1[0x1d] = 0;
  }
  return iVar8;
LAB_00153a77:
  *(mtree_entry_conflict **)(pcVar13 + 0x10) = pmVar17;
  pcVar13[0x20] = '\0';
  pcVar13[0x21] = '\0';
  pcVar13[0x22] = '\0';
  pcVar13[0x23] = '\0';
  pcVar13[0x24] = '\0';
  pcVar13[0x25] = '\0';
  pcVar13[0x26] = '\0';
  pcVar13[0x27] = '\0';
  archive_string_ensure(local_148,(pmVar17->parentdir).length + (pmVar17->basename).length + 2);
  sVar2 = (pmVar17->parentdir).length;
  if ((pmVar17->basename).length + sVar2 == 0) {
    *dest->s = '\0';
  }
  else {
    if (sVar2 != 0) {
      pcVar13[0x20] = '\0';
      pcVar13[0x21] = '\0';
      pcVar13[0x22] = '\0';
      pcVar13[0x23] = '\0';
      pcVar13[0x24] = '\0';
      pcVar13[0x25] = '\0';
      pcVar13[0x26] = '\0';
      pcVar13[0x27] = '\0';
      archive_string_concat(dest,&pmVar17->parentdir);
      archive_strappend_char(dest,'/');
    }
    archive_string_concat(dest,&pmVar17->basename);
  }
  iVar9 = __archive_rb_tree_insert_node(&pmVar17->dir_info->rbtree,&me->rbnode);
  if (iVar9 != 0) {
    me->parent = pmVar17;
    me->next = (mtree_entry_conflict *)0x0;
    **(undefined8 **)(pcVar13 + 0x38) = me;
    *(mtree_entry_conflict ***)(pcVar13 + 0x38) = &me->next;
    me = local_170;
    goto LAB_00153cd8;
  }
  pmVar12 = (mtree_entry_conflict *)
            __archive_rb_tree_find_node(&pmVar17->dir_info->rbtree,(me->basename).s);
  goto LAB_00153b8b;
}

Assistant:

static int
archive_write_mtree_header(struct archive_write *a,
    struct archive_entry *entry)
{
	struct mtree_writer *mtree= a->format_data;
	struct mtree_entry *mtree_entry;
	int r, r2;

	if (mtree->first) {
		mtree->first = 0;
		archive_strcat(&mtree->buf, "#mtree\n");
		if ((mtree->keys & SET_KEYS) == 0)
			mtree->output_global_set = 0;/* Disabled. */
	}

	mtree->entry_bytes_remaining = archive_entry_size(entry);

	/* While directory only mode, we do not handle non directory files. */
	if (mtree->dironly && archive_entry_filetype(entry) != AE_IFDIR)
		return (ARCHIVE_OK);

	r2 = mtree_entry_new(a, entry, &mtree_entry);
	if (r2 < ARCHIVE_WARN)
		return (r2);
	r = mtree_entry_tree_add(a, &mtree_entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(mtree_entry);
		return (r);
	}
	mtree->mtree_entry = mtree_entry;

	/* If the current file is a regular file, we have to
	 * compute the sum of its content.
	 * Initialize a bunch of sum check context. */
	if (mtree_entry->reg_info)
		sum_init(mtree);

	return (r2);
}